

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setImageLimited<float>
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this,
          Image<float,_gimage::PixelTraits<float>_> *a)

{
  float ***pppfVar1;
  unsigned_short ***pppuVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long i;
  ulong uVar10;
  
  setSize(this,a->width,a->height,(long)a->depth);
  uVar5 = 0;
  uVar4 = this->height;
  if (this->height < 1) {
    uVar4 = uVar5;
  }
  uVar3 = (ulong)(uint)this->depth;
  if (this->depth < 1) {
    uVar3 = uVar5;
  }
  for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
    uVar8 = this->width;
    if (this->width < 1) {
      uVar8 = uVar5;
    }
    for (uVar9 = 0; uVar9 != uVar4; uVar9 = uVar9 + 1) {
      pppfVar1 = a->img;
      pppuVar2 = this->img;
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        iVar6 = (int)pppfVar1[uVar7][uVar9][uVar10];
        if (0xfffe < iVar6) {
          iVar6 = 0xffff;
        }
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        pppuVar2[uVar7][uVar9][uVar10] = (unsigned_short)iVar6;
      }
    }
  }
  return;
}

Assistant:

void setImageLimited(const Image<S> &a)
    {
      setSize(a.getWidth(), a.getHeight(), a.getDepth());

      for (int j=0; j<depth; j++)
        for (long k=0; k<height; k++)
          for (long i=0; i<width; i++)
          {
            img[j][k][i]=ptraits::limit(static_cast<work_t>(a.get(i, k, j)));
          }
    }